

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

int __thiscall kj::anon_unknown_9::DiskFile::truncate(DiskFile *this,char *__file,__off_t __length)

{
  int iVar1;
  uint64_t size_local;
  DiskFile *this_local;
  
  iVar1 = DiskHandle::truncate(&this->super_DiskHandle,__file,__length);
  return iVar1;
}

Assistant:

void truncate(uint64_t size) const override {
    DiskHandle::truncate(size);
  }